

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DIP.cpp
# Opt level: O3

void __thiscall Car::Car(Car *this,shared_ptr<Engine> *engine,shared_ptr<ILogger> *logg)

{
  element_type *peVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  long *local_38 [2];
  long local_28 [2];
  
  (this->engine).super___shared_ptr<Engine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar6 = (engine->super___shared_ptr<Engine,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var7 = (engine->super___shared_ptr<Engine,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (engine->super___shared_ptr<Engine,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->engine).super___shared_ptr<Engine,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar6;
  (this->engine).super___shared_ptr<Engine,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var7;
  (engine->super___shared_ptr<Engine,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  (this->logger).super___shared_ptr<ILogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uVar2 = *(undefined4 *)&(logg->super___shared_ptr<ILogger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar3 = *(undefined4 *)
           ((long)&(logg->super___shared_ptr<ILogger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + 4);
  uVar4 = *(undefined4 *)
           &(logg->super___shared_ptr<ILogger,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  uVar5 = *(undefined4 *)
           ((long)&(logg->super___shared_ptr<ILogger,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
           + 4);
  (logg->super___shared_ptr<ILogger,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined4 *)&(this->logger).super___shared_ptr<ILogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       uVar2;
  *(undefined4 *)
   ((long)&(this->logger).super___shared_ptr<ILogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) =
       uVar3;
  *(undefined4 *)
   &(this->logger).super___shared_ptr<ILogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = uVar4
  ;
  *(undefined4 *)
   ((long)&(this->logger).super___shared_ptr<ILogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
   + 4) = uVar5;
  (logg->super___shared_ptr<ILogger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  peVar1 = (this->logger).super___shared_ptr<ILogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"car is created","");
  (*peVar1->_vptr_ILogger[2])(peVar1,local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return;
}

Assistant:

explicit Car(std::shared_ptr<Engine> engine, std::shared_ptr<ILogger> logg)
		:	engine(std::move(engine)),
			logger(std::move(logg))
	{
		logger->log("car is created");
	}